

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

RealType __thiscall
OpenMD::EAM::Zhou2005Functional
          (EAM *this,RealType rho,RealType rhoe,RealType rhos,
          vector<double,_std::allocator<double>_> *Fn,vector<double,_std::allocator<double>_> *F,
          RealType F3plus,RealType F3minus,RealType Fe,RealType eta)

{
  reference pvVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  RealType t;
  RealType functional;
  RealType rho0;
  RealType rhon;
  size_type in_stack_fffffffffffffef8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff00;
  undefined8 local_68;
  
  dVar2 = in_XMM1_Qa * 0.85;
  local_68 = 0.0;
  if (dVar2 <= in_XMM0_Qa) {
    if ((in_XMM0_Qa < dVar2) || (in_XMM1_Qa <= in_XMM0_Qa)) {
      if ((in_XMM0_Qa < in_XMM1_Qa) || (in_XMM1_Qa * 1.15 <= in_XMM0_Qa)) {
        if (in_XMM1_Qa * 1.15 <= in_XMM0_Qa) {
          dVar2 = pow(in_XMM0_Qa / in_XMM2_Qa,in_XMM6_Qa);
          dVar2 = log(dVar2);
          local_68 = pow(in_XMM0_Qa / in_XMM2_Qa,in_XMM6_Qa);
          local_68 = in_XMM5_Qa * (1.0 - dVar2) * local_68;
        }
      }
      else {
        dVar4 = in_XMM0_Qa / in_XMM1_Qa - 1.0;
        pvVar1 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        local_68 = *pvVar1;
        pvVar1 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        dVar2 = *pvVar1;
        pvVar1 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        local_68 = dVar4 * (dVar4 * (dVar4 * in_XMM3_Qa + *pvVar1) + dVar2) + local_68;
      }
    }
    else {
      dVar4 = in_XMM0_Qa / in_XMM1_Qa - 1.0;
      pvVar1 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_68 = *pvVar1;
      pvVar1 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      dVar2 = *pvVar1;
      pvVar1 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_68 = dVar4 * (dVar4 * (dVar4 * in_XMM4_Qa + *pvVar1) + dVar2) + local_68;
    }
  }
  else {
    dVar3 = in_XMM0_Qa / dVar2 - 1.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_68 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    dVar2 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    dVar4 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_68 = dVar3 * (dVar3 * (dVar3 * *pvVar1 + dVar4) + dVar2) + local_68;
  }
  return local_68;
}

Assistant:

RealType EAM::Zhou2005Functional(RealType rho, RealType rhoe, RealType rhos,
                                   std::vector<RealType> Fn,
                                   std::vector<RealType> F, RealType F3plus,
                                   RealType F3minus, RealType Fe,
                                   RealType eta) {
    RealType rhon = 0.85 * rhoe;
    RealType rho0 = 1.15 * rhoe;
    RealType functional(0.0);
    RealType t;
    if (rho < rhon) {
      t          = rho / rhon - 1.0;
      functional = Fn.at(0) + t * (Fn.at(1) + t * (Fn.at(2) + t * Fn.at(3)));
    } else if (rho >= rhon && rho < rhoe) {
      t          = rho / rhoe - 1.0;
      functional = F.at(0) + t * (F.at(1) + t * (F.at(2) + t * F3minus));
    } else if (rho >= rhoe && rho < rho0) {
      t          = rho / rhoe - 1.0;
      functional = F.at(0) + t * (F.at(1) + t * (F.at(2) + t * F3plus));
    } else if (rho >= rho0) {
      t          = rho / rhos;
      functional = Fe * (1.0 - log(pow(t, eta))) * pow(t, eta);
    }
    return functional;
  }